

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::GoniometricLight::SampleLe
          (LightLeSample *__return_storage_ptr__,GoniometricLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [56];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [56];
  undefined1 auVar29 [16];
  Vector3f wl;
  SampledSpectrum SVar30;
  Float pdf;
  undefined8 local_128;
  ulong uStack_120;
  float local_e8;
  ulong uStack_e0;
  uint local_cc;
  float fStack_c8;
  Point3fi local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_40 [16];
  Interval<float> local_30;
  undefined1 auVar23 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar27 [64];
  
  auVar18._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u1,&local_6c);
  auVar18._8_56_ = extraout_var_00;
  auVar5 = vmovshdup_avx(auVar18._0_16_);
  fVar13 = cosf(auVar5._0_4_);
  auVar19._0_4_ = sinf(auVar5._0_4_);
  auVar19._4_60_ = extraout_var;
  local_88._0_4_ = auVar19._0_4_;
  auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19._0_16_);
  uVar6 = vcmpss_avx512f(auVar19._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar8 = (bool)((byte)uVar6 & 1);
  fVar11 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar5._0_4_);
  local_e8 = auVar18._0_4_;
  fVar14 = cosf(local_e8);
  fVar15 = sinf(local_e8);
  uVar1 = (this->super_LightBase).mediumInterface.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  auVar5 = vinsertps_avx(ZEXT416((uint)(fVar14 * fVar11)),ZEXT416((uint)(fVar15 * fVar11)),0x10);
  uVar6 = vmovlps_avx(auVar5);
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar13));
  uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar13),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar8 = (bool)((byte)uVar7 & 1);
  auVar12._4_12_ = auVar4._4_12_;
  auVar12._0_4_ = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar4._0_4_);
  local_40 = vmovlhps_avx(ZEXT816(0),ZEXT816(0));
  fStack_c8 = (float)((ulong)uVar6 >> 0x20);
  local_30 = (Interval<float>)vmovlps_avx(ZEXT816(0));
  local_cc = (uint)uVar6;
  Transform::operator()(&local_b8,&(this->super_LightBase).renderFromLight,(Point3fi *)local_40);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fStack_c8 *
                                         (this->super_LightBase).renderFromLight.m.m[1][1])),
                           ZEXT416(local_cc),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fStack_c8 *
                                          (this->super_LightBase).renderFromLight.m.m[0][1])),
                            ZEXT416(local_cc),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fStack_c8 *
                                          (this->super_LightBase).renderFromLight.m.m[2][1])),
                            ZEXT416(local_cc),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  local_98 = vfmadd231ss_fma(auVar9,auVar12,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar9 = vfmadd231ss_fma(auVar10,auVar12,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  auVar10 = vfmadd231ss_fma(auVar16,auVar12,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar25._0_12_ = ZEXT812(0);
  auVar25._12_4_ = 0;
  fVar11 = local_98._0_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar9,auVar9);
  auVar16 = vfmadd231ss_fma(auVar16,auVar10,auVar10);
  if (auVar16._0_4_ <= 0.0) {
    auVar16._8_8_ = 0;
    auVar16._0_4_ =
         local_b8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar16._4_4_ =
         local_b8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
  }
  else {
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar2 = vandps_avx(local_98,auVar29);
    auVar3 = vandps_avx(auVar9,auVar29);
    auVar29 = vandps_avx(auVar10,auVar29);
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ * 0.0)),auVar25,auVar3);
    auVar25 = vfmadd231ss_fma(auVar2,auVar25,auVar29);
    fVar14 = auVar25._0_4_ / auVar16._0_4_;
    fVar13 = auVar9._0_4_ * fVar14;
    local_58 = ZEXT416((uint)(auVar10._0_4_ * fVar14));
    i.high = fVar13;
    i.low = fVar13;
    local_68 = ZEXT416((uint)(fVar11 * fVar14));
    auVar20._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_b8,i);
    auVar20._8_56_ = extraout_var_01;
    uVar6 = vmovlps_avx(auVar20._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar6;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar6 >> 0x20);
    i_00.high = (float)local_68._0_4_;
    i_00.low = (float)local_68._0_4_;
    auVar21._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar21._8_56_ = extraout_var_02;
    uVar6 = vmovlps_avx(auVar21._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar6;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar6 >> 0x20);
    i_01.high = (float)local_58._0_4_;
    i_01.low = (float)local_58._0_4_;
    auVar22._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar22._8_56_ = extraout_var_03;
    auVar16 = auVar22._0_16_;
  }
  auVar26._0_12_ = ZEXT812(0);
  auVar26._12_4_ = 0;
  uVar6 = vcmpss_avx512f(ZEXT416((uint)local_88._0_4_),auVar26,0);
  local_88 = ZEXT416((uint)!(bool)((byte)uVar6 & 1) * (int)(local_6c / (float)local_88._0_4_));
  auVar16 = vhaddps_avx(auVar16,auVar16);
  auVar9 = vinsertps_avx(auVar9,local_98,0x10);
  auVar3._4_4_ = local_b8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar3._0_4_ = local_b8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar3._8_4_ = local_b8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar3._12_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar25 = vinsertps_avx(auVar3,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar17._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar25._0_4_;
  auVar17._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar25._4_4_;
  auVar17._8_4_ = auVar25._8_4_ + 0.0;
  auVar17._12_4_ = auVar25._12_4_ + 0.0;
  auVar2._8_4_ = 0x3f000000;
  auVar2._0_8_ = 0x3f0000003f000000;
  auVar2._12_4_ = 0x3f000000;
  local_98 = vmulps_avx512vl(auVar17,auVar2);
  uStack_e0 = auVar4._8_8_;
  local_128 = auVar5._0_8_;
  uStack_120 = auVar5._8_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar12._0_4_;
  wl.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_128;
  wl.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_128._4_4_;
  auVar28 = ZEXT856(uStack_e0);
  auVar24 = ZEXT856(uStack_120);
  SVar30 = Scale(this,wl,lambda);
  auVar27._0_8_ = SVar30.values.values._8_8_;
  auVar27._8_56_ = auVar28;
  auVar23._0_8_ = SVar30.values.values._0_8_;
  auVar23._8_56_ = auVar24;
  auVar5 = vmovlhps_avx(auVar23._0_16_,auVar27._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar5;
  uVar6 = vmovlps_avx(local_98);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar6;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = auVar16._0_4_ * 0.5;
  uVar6 = vmovlps_avx(auVar9);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = auVar10._0_4_;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar1;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = (Float)local_88._0_4_;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample GoniometricLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f uv = distrib.Sample(u1, &pdf);
    Float theta = uv[1], phi = uv[0];
    Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
    Vector3f wl = SphericalDirection(sinTheta, cosTheta, phi);
    Float pdfDir = sinTheta == 0 ? 0 : pdf / sinTheta;

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.inside));
    return LightLeSample(Scale(wl, lambda), ray, 1, pdfDir);
}